

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

double __thiscall
ON_NurbsCurve::GetCubicBezierApproximation
          (ON_NurbsCurve *this,double max_deviation,ON_3dPoint *bezCV)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  ON_NurbsCurve *local_5a0;
  ON_NurbsCurve *local_598;
  bool local_579;
  double *local_570;
  double **local_550;
  double s;
  double t;
  int pass;
  int i;
  double d;
  undefined1 local_4d8 [8];
  ON_3dPoint B;
  ON_3dPoint A;
  ON_BezierCurve bez;
  double *k;
  double *g;
  double g32 [32];
  double deviation1;
  double deviation0;
  double zero_tol;
  ON_3dPoint local_348;
  ON_3dVector local_330;
  ON_3dPoint local_318;
  ON_3dVector local_300;
  ON_3dVector local_2e8;
  ON_3dVector local_2d0;
  ON_3dPoint local_2b8;
  ON_3dPoint local_2a0;
  ON_3dVector local_288;
  ON_3dPoint local_270;
  ON_3dVector local_258;
  ON_3dVector local_240;
  ON_3dVector local_228;
  undefined4 local_20c;
  undefined1 auStack_208 [4];
  int hint;
  ON_3dPoint P [2];
  ON_3dPoint local_1c0;
  ON_3dVector local_1a8;
  ON_3dPoint local_190;
  ON_3dPoint local_178;
  ON_3dPoint local_160;
  undefined1 local_148 [8];
  ON_3dVector D [2];
  double c;
  ON_3dPoint bez1CV [4];
  ON_3dPoint bez0CV [4];
  undefined1 local_40 [8];
  ON_Interval domain;
  double failed_rc;
  ON_3dPoint *bezCV_local;
  double max_deviation_local;
  ON_NurbsCurve *this_local;
  
  domain.m_t[1] = ON_DBL_QNAN;
  bVar2 = ON_Object::ThisIsNullptr((ON_Object *)this,false);
  if (bVar2) {
    this_local = (ON_NurbsCurve *)domain.m_t[1];
  }
  else if (this->m_order < 2) {
    this_local = (ON_NurbsCurve *)domain.m_t[1];
  }
  else if (this->m_cv_count < this->m_order) {
    this_local = (ON_NurbsCurve *)domain.m_t[1];
  }
  else if (bezCV == (ON_3dPoint *)0x0) {
    this_local = (ON_NurbsCurve *)domain.m_t[1];
  }
  else {
    if (((this->m_is_rat == 0) && (this->m_order == 4)) && (this->m_cv_count == 4)) {
      if ((*this->m_knot == this->m_knot[2]) && (!NAN(*this->m_knot) && !NAN(this->m_knot[2]))) {
        if ((this->m_knot[3] == this->m_knot[5]) && (!NAN(this->m_knot[3]) && !NAN(this->m_knot[5]))
           ) {
          GetCV(this,0,bezCV);
          GetCV(this,1,bezCV + 1);
          GetCV(this,2,bezCV + 2);
          GetCV(this,3,bezCV + 3);
          return (double)(ON_NurbsCurve *)0x0;
        }
      }
    }
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    bez1CV[3].z = ON_3dPoint::Origin.x;
    bez0CV[0].x = ON_3dPoint::Origin.y;
    bez0CV[0].y = ON_3dPoint::Origin.z;
    bez0CV[0].z = ON_3dPoint::Origin.x;
    bez0CV[1].x = ON_3dPoint::Origin.y;
    bez0CV[1].y = ON_3dPoint::Origin.z;
    bez0CV[1].z = ON_3dPoint::Origin.x;
    bez0CV[2].x = ON_3dPoint::Origin.y;
    bez0CV[2].y = ON_3dPoint::Origin.z;
    bez0CV[2].z = ON_3dPoint::Origin.x;
    bez0CV[3].x = ON_3dPoint::Origin.y;
    bez0CV[3].y = ON_3dPoint::Origin.z;
    c = ON_3dPoint::Origin.x;
    bez1CV[0].x = ON_3dPoint::Origin.y;
    bez1CV[0].y = ON_3dPoint::Origin.z;
    bez1CV[0].z = ON_3dPoint::Origin.x;
    bez1CV[1].x = ON_3dPoint::Origin.y;
    bez1CV[1].y = ON_3dPoint::Origin.z;
    bez1CV[1].z = ON_3dPoint::Origin.x;
    bez1CV[2].x = ON_3dPoint::Origin.y;
    bez1CV[2].y = ON_3dPoint::Origin.z;
    bez1CV[2].z = ON_3dPoint::Origin.x;
    bez1CV[3].x = ON_3dPoint::Origin.y;
    bez1CV[3].y = ON_3dPoint::Origin.z;
    ON_Interval::operator[]((ON_Interval *)local_40,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (this,1,3,&c,0,0);
    ON_Interval::operator[]((ON_Interval *)local_40,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (this,1,3,&bez1CV[1].z,0,0);
    bez1CV[3].z = c;
    bez0CV[0].x = bez1CV[0].x;
    bez0CV[0].y = bez1CV[0].y;
    bez0CV[2].z = bez1CV[1].z;
    bez0CV[3].x = bez1CV[2].x;
    bez0CV[3].y = bez1CV[2].y;
    dVar4 = ON_Interval::operator[]((ON_Interval *)local_40,1);
    dVar5 = ON_Interval::operator[]((ON_Interval *)local_40,0);
    ::operator*(&local_160,dVar4 - dVar5,(ON_3dPoint *)&bez1CV[0].z);
    ON_3dVector::ON_3dVector((ON_3dVector *)local_148,&local_160);
    ::operator*(&local_178,dVar4 - dVar5,(ON_3dPoint *)&bez1CV[2].z);
    ON_3dVector::ON_3dVector((ON_3dVector *)&D[0].z,&local_178);
    ON_3dVector::operator/(&local_1a8,(ON_3dVector *)local_148,3.0);
    ON_3dPoint::operator+(&local_190,(ON_3dPoint *)&bez1CV[3].z,&local_1a8);
    bez1CV[0].z = local_190.x;
    bez1CV[1].x = local_190.y;
    bez1CV[1].y = local_190.z;
    ON_3dVector::operator/((ON_3dVector *)&P[1].z,(ON_3dVector *)&D[0].z,3.0);
    ON_3dPoint::operator-(&local_1c0,(ON_3dPoint *)&bez0CV[2].z,(ON_3dVector *)&P[1].z);
    bez1CV[1].z = local_1c0.x;
    bez1CV[2].x = local_1c0.y;
    bez1CV[2].y = local_1c0.z;
    bez1CV[2].z = bez0CV[2].z;
    bez1CV[3].x = bez0CV[3].x;
    bez1CV[3].y = bez0CV[3].y;
    _auStack_208 = ON_3dPoint::Origin.x;
    P[0].x = ON_3dPoint::Origin.y;
    P[0].y = ON_3dPoint::Origin.z;
    P[0].z = ON_3dPoint::Origin.x;
    P[1].x = ON_3dPoint::Origin.y;
    P[1].y = ON_3dPoint::Origin.z;
    local_20c = 0;
    ON_Interval::ParameterAt((ON_Interval *)local_40,0.3333333333333333);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (this,0,3,auStack_208,0,&local_20c);
    ON_Interval::ParameterAt((ON_Interval *)local_40,0.6666666666666666);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
              (this,0,3,&P[0].z,0,&local_20c);
    ::operator*(&local_270,2.5,(ON_3dPoint *)&bez1CV[3].z);
    ON_3dPoint::operator-(&local_258,(ON_3dPoint *)&bez0CV[2].z,&local_270);
    ON_3dVector::operator/(&local_240,&local_258,3.0);
    ::operator*(&local_2a0,3.0,(ON_3dPoint *)auStack_208);
    ::operator*(&local_2b8,1.5,(ON_3dPoint *)&P[0].z);
    ON_3dPoint::operator-(&local_288,&local_2a0,&local_2b8);
    ON_3dVector::operator+(&local_228,&local_240,&local_288);
    ON_3dPoint::operator=((ON_3dPoint *)&bez0CV[0].z,&local_228);
    ::operator*(&local_318,2.5,(ON_3dPoint *)&bez0CV[2].z);
    ON_3dPoint::operator-(&local_300,(ON_3dPoint *)&bez1CV[3].z,&local_318);
    ON_3dVector::operator/(&local_2e8,&local_300,3.0);
    ::operator*(&local_348,3.0,(ON_3dPoint *)&P[0].z);
    ::operator*((ON_3dPoint *)&zero_tol,1.5,(ON_3dPoint *)auStack_208);
    ON_3dPoint::operator-(&local_330,&local_348,(ON_3dPoint *)&zero_tol);
    ON_3dVector::operator+(&local_2d0,&local_2e8,&local_330);
    ON_3dPoint::operator=((ON_3dPoint *)&bez0CV[1].z,&local_2d0);
    deviation0 = 0.0;
    deviation1 = 0.0;
    g32[0x1f] = 0.0;
    if (((this->m_order != 4) || (this->m_cv_count != 4)) || (this->m_is_rat != 0)) {
      if (this->m_cv_count < 0x21) {
        local_550 = &g;
      }
      else {
        local_550 = (double **)onmalloc((long)this->m_cv_count << 3);
      }
      GetGrevilleAbcissae(this,(double *)local_550);
      if (this->m_order == 3) {
        pdVar1 = this->m_knot;
        if (*pdVar1 < pdVar1[2]) {
          *local_550 = (double *)pdVar1[2];
          local_550[1] = (double *)((pdVar1[2] + pdVar1[2] + pdVar1[3]) / 3.0);
        }
        iVar3 = this->m_cv_count - this->m_order;
        if (pdVar1[(long)iVar3 + 3] < pdVar1[(long)iVar3 + 5]) {
          local_550[this->m_cv_count + -1] = (double *)pdVar1[(long)iVar3 + 3];
          local_550[this->m_cv_count + -2] =
               (double *)
               ((pdVar1[(long)iVar3 + 3] + pdVar1[(long)iVar3 + 3] + pdVar1[(long)iVar3 + 2]) / 3.0)
          ;
        }
      }
      ON_BezierCurve::ON_BezierCurve((ON_BezierCurve *)&A.z);
      A.z._0_4_ = 3;
      A.z._4_4_ = 0;
      ON_BezierCurve::Evaluate((ON_BezierCurve *)&A.z,0.3333333333333333,0,3,&B.z);
      ON_BezierCurve::Evaluate((ON_BezierCurve *)&A.z,0.6666666666666666,0,3,(double *)local_4d8);
      dVar4 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_208,(ON_3dPoint *)&B.z);
      dVar5 = ON_3dPoint::DistanceTo((ON_3dPoint *)&P[0].z,(ON_3dPoint *)local_4d8);
      deviation0 = (dVar4 + dVar5) * 16.0 + 1e-14;
      for (t._4_4_ = 1; t._4_4_ < this->m_cv_count; t._4_4_ = t._4_4_ + 1) {
        for (t._0_4_ = 0; t._0_4_ < 2; t._0_4_ = t._0_4_ + 1) {
          if (t._0_4_ == 0) {
            local_570 = (double *)
                        (((double)local_550[t._4_4_ + -1] + (double)local_550[t._4_4_]) * 0.5);
          }
          else {
            local_570 = local_550[t._4_4_];
          }
          dVar4 = ON_Interval::NormalizedParameterAt((ON_Interval *)local_40,(double)local_570);
          local_579 = 0.0 < dVar4 && dVar4 < 1.0;
          if (local_579) {
            (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
                      (local_570,this,0,3,&B.z,0,&local_20c);
            ON_BezierCurve::Evaluate((ON_BezierCurve *)&A.z,dVar4,0,3,(double *)local_4d8);
            dVar5 = ON_3dPoint::DistanceTo((ON_3dPoint *)&B.z,(ON_3dPoint *)local_4d8);
            if (deviation1 < dVar5) {
              deviation1 = dVar5;
            }
            ON_BezierCurve::Evaluate((ON_BezierCurve *)&A.z,dVar4,0,3,(double *)local_4d8);
            dVar4 = ON_3dPoint::DistanceTo((ON_3dPoint *)&B.z,(ON_3dPoint *)local_4d8);
            if (g32[0x1f] < dVar4) {
              g32[0x1f] = dVar4;
            }
            if (((deviation0 < max_deviation) && (max_deviation < deviation1)) &&
               (max_deviation < g32[0x1f])) {
              this_local = (ON_NurbsCurve *)domain.m_t[1];
              bVar2 = true;
              goto LAB_0077e306;
            }
          }
        }
      }
      if (local_550 != &g) {
        onfree(local_550);
      }
      bVar2 = false;
LAB_0077e306:
      ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)&A.z);
      if (bVar2) {
        return (double)this_local;
      }
    }
    if ((g32[0x1f] <= deviation0) || (g32[0x1f] <= deviation1)) {
      bezCV->x = c;
      bezCV->y = bez1CV[0].x;
      bezCV->z = bez1CV[0].y;
      bezCV[1].x = bez1CV[0].z;
      bezCV[1].y = bez1CV[1].x;
      bezCV[1].z = bez1CV[1].y;
      bezCV[2].x = bez1CV[1].z;
      bezCV[2].y = bez1CV[2].x;
      bezCV[2].z = bez1CV[2].y;
      bezCV[3].x = bez1CV[2].z;
      bezCV[3].y = bez1CV[3].x;
      bezCV[3].z = bez1CV[3].y;
      if (g32[0x1f] <= deviation0) {
        local_598 = (ON_NurbsCurve *)0x0;
      }
      else {
        local_598 = (ON_NurbsCurve *)g32[0x1f];
      }
      this_local = local_598;
    }
    else {
      bezCV->x = bez1CV[3].z;
      bezCV->y = bez0CV[0].x;
      bezCV->z = bez0CV[0].y;
      bezCV[1].x = bez0CV[0].z;
      bezCV[1].y = bez0CV[1].x;
      bezCV[1].z = bez0CV[1].y;
      bezCV[2].x = bez0CV[1].z;
      bezCV[2].y = bez0CV[2].x;
      bezCV[2].z = bez0CV[2].y;
      bezCV[3].x = bez0CV[2].z;
      bezCV[3].y = bez0CV[3].x;
      bezCV[3].z = bez0CV[3].y;
      if (deviation1 <= deviation0) {
        local_5a0 = (ON_NurbsCurve *)0x0;
      }
      else {
        local_5a0 = (ON_NurbsCurve *)deviation1;
      }
      this_local = local_5a0;
    }
  }
  return (double)this_local;
}

Assistant:

double ON_NurbsCurve::GetCubicBezierApproximation(
  double max_deviation,
  ON_3dPoint bezCV[4]
) const
{
  const double failed_rc = ON_DBL_QNAN;

  if (ThisIsNullptr(false))
    return failed_rc;
  if (m_order < 2)
    return failed_rc;
  if (m_cv_count < m_order)
    return failed_rc;
  if ( nullptr == bezCV)
    return failed_rc;

  if (
    0 == m_is_rat
    && 4 == m_order
    && 4 == m_cv_count
    && m_knot[0] == m_knot[2]
    && m_knot[3] == m_knot[5]
    )
  {
    GetCV(0, bezCV[0]);
    GetCV(1, bezCV[1]);
    GetCV(2, bezCV[2]);
    GetCV(3, bezCV[3]);
    return 0.0;
  }

  const ON_Interval domain = Domain();


  // bez0CV[] are cubic bezier control points set from end locations and interpolating 2 interior points.
  ON_3dPoint bez0CV[4] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };
  // bez1CV[] are cubic bezier control points set from end locations and derivatives.
  ON_3dPoint bez1CV[4] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };

  // bez1CV[] are cubic bezier control points set from end locations and derivatives.
  Evaluate(domain[0], 1, 3, &bez1CV[0].x, 0, nullptr);
  Evaluate(domain[1], 1, 3, &bez1CV[2].x, 0, nullptr);
  bez0CV[0] = bez1CV[0];
  bez0CV[3] = bez1CV[2];
  const double c = domain[1] - domain[0];
  const ON_3dVector D[2]{ c * bez1CV[1], c * bez1CV[3] };
  bez1CV[1] = bez0CV[0] + D[0]/3.0;
  bez1CV[2] = bez0CV[3] - D[1]/3.0;
  bez1CV[3] = bez0CV[3];

  // bez0CV[] are cubic bezier control points set from end locations and interpolating 2 interior points.
  ON_3dPoint P[2] = {ON_3dPoint::Origin,ON_3dPoint::Origin};
  int hint = 0;
  Evaluate(domain.ParameterAt(1.0/3.0), 0, 3, &P[0].x, 0, &hint);
  Evaluate(domain.ParameterAt(2.0/3.0), 0, 3, &P[1].x, 0, &hint);
  bez0CV[1] = (bez0CV[3] - 2.5*bez0CV[0])/3.0 + (3.0*P[0] - 1.5*P[1]);
  bez0CV[2] = (bez0CV[0] - 2.5*bez0CV[3])/3.0 + (3.0*P[1] - 1.5*P[0]);

  double zero_tol = 0.0;
  double deviation0 = 0.0;
  double deviation1 = 0.0;
  if (4 != m_order || 4 != m_cv_count || 0 != m_is_rat)
  {
    // g[] = parameters for evaluation test
    double g32[32];
    double* g = (m_cv_count <= 32) ? g32 : (double*)onmalloc(m_cv_count * sizeof(g[0]));
    GetGrevilleAbcissae(g);
    if (3 == m_order)
    {
      const double* k = m_knot;
      if (k[0] < k[2])
      {
        g[0] = k[2];
        g[1] = (2.0*k[2] + k[3]) / 3.0;
      }
      k += (m_cv_count - m_order);
      if (k[3] < k[5])
      {
        g[m_cv_count - 1] = k[3];
        g[m_cv_count - 2] = (2.0*k[3] + k[2]) / 3.0;
      }
    }
  
    // test evaluation
    ON_BezierCurve bez;
    bez.m_dim = 3;
    bez.m_is_rat = 0;
    bez.m_order = 4;
    bez.m_cv_stride = 3;
    bez.m_cv = &bez0CV[0].x;

    ON_3dPoint A, B;
    bez.Evaluate(1.0 / 3.0, 0, 3, &A.x);
    bez.Evaluate(2.0 / 3.0, 0, 3, &B.x);
    zero_tol = 16.0*(P[0].DistanceTo(A) + P[1].DistanceTo(B)) + 1.0e-14;
    double d;
    for (int i = 1; i < m_cv_count; i++)
    {
      for (int pass = 0; pass < 2; pass++)
      {
        const double t = (0==pass) ? 0.5*(g[i - 1] + g[i]) : g[i];
        const double s = domain.NormalizedParameterAt(t);
        if (false == (s > 0.0 && s < 1.0))
          continue;

        Evaluate(t, 0, 3, &A.x, 0, &hint);

        // test bez0CV[]
        bez.m_cv = &bez0CV[0].x;
        bez.Evaluate(s, 0, 3, &B.x);
        d = A.DistanceTo(B);
        if (d > deviation0)
          deviation0 = d;

        // test bez1CV[]
        bez.m_cv = &bez1CV[0].x;
        bez.Evaluate(s, 0, 3, &B.x);
        d = A.DistanceTo(B);
        if (d > deviation1)
          deviation1 = d;

        if (max_deviation > zero_tol && deviation0 > max_deviation && deviation1 > max_deviation)
          return failed_rc;
      }
    }

    bez.m_cv = nullptr;

    if (g != g32)
      onfree(g);
  }


  if (deviation1 <= zero_tol || deviation1 <= deviation0)
  {
    // use cubic bezier CVs calculated from end locations and interpolating end derivatives.
    bezCV[0] = bez1CV[0];
    bezCV[1] = bez1CV[1];
    bezCV[2] = bez1CV[2];
    bezCV[3] = bez1CV[3];
    return (deviation1 > zero_tol) ? deviation1 : 0.0;
  }

  // use cubic bezier CVs calculated from end locations and interpolating 2 interior points.
  bezCV[0] = bez0CV[0];
  bezCV[1] = bez0CV[1];
  bezCV[2] = bez0CV[2];
  bezCV[3] = bez0CV[3];
  return (deviation0 > zero_tol) ? deviation0 : 0.0;
}